

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

ProString * __thiscall ProStringRwUser::extract(ProStringRwUser *this,QString *s)

{
  ProString *other;
  long in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff88;
  ProString *this_00;
  bool local_51;
  ProString local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_51 = QString::isSharedWith(&in_RDI->m_string,in_stack_ffffffffffffff88);
  if (local_51) {
    other = *(ProString **)(in_RSI + 8);
  }
  else {
    ProString::ProString(this_00,in_stack_ffffffffffffff88);
    other = ProString::setSource(&local_38,*(ProString **)(in_RSI + 8));
  }
  local_51 = !local_51;
  ProString::ProString(this_00,other);
  if (local_51) {
    ProString::~ProString((ProString *)0x2d03df);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

ProString extract(const QString &s) const
        { return s.isSharedWith(*m_rs) ? *m_ps : ProString(s).setSource(*m_ps); }